

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall kj::File::copy(File *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong uVar1;
  long in_RCX;
  size_t result;
  long lVar2;
  ulong in_R8;
  byte buffer [8192];
  undefined1 local_2038 [8200];
  
  lVar2 = 0;
  while( true ) {
    if (in_R8 == 0) {
      return (int)lVar2;
    }
    uVar1 = 0x2000;
    if (in_R8 < 0x2000) {
      uVar1 = in_R8;
    }
    uVar1 = (**(code **)(*(long *)src + 0x30))(src,in_RCX,local_2038,uVar1);
    (*(this->super_ReadableFile).super_FsNode._vptr_FsNode[9])(this,dst,local_2038,uVar1);
    lVar2 = lVar2 + uVar1;
    if (uVar1 < 0x2000) break;
    in_RCX = in_RCX + uVar1;
    dst = dst + uVar1;
    in_R8 = in_R8 - uVar1;
  }
  return (int)lVar2;
}

Assistant:

size_t File::copy(uint64_t offset, const ReadableFile& from,
                  uint64_t fromOffset, uint64_t size) const {
  byte buffer[8192];

  size_t result = 0;
  while (size > 0) {
    size_t n = from.read(fromOffset, kj::arrayPtr(buffer, kj::min(sizeof(buffer), size)));
    write(offset, arrayPtr(buffer, n));
    result += n;
    if (n < sizeof(buffer)) {
      // Either we copied the amount requested or we hit EOF.
      break;
    }
    fromOffset += n;
    offset += n;
    size -= n;
  }

  return result;
}